

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

void __thiscall QRegion::QRegion(QRegion *this,QBitmap *bm)

{
  bool bVar1;
  QRegionData *pQVar2;
  QRegionPrivate *pQVar3;
  
  bVar1 = QPixmap::isNull(&bm->super_QPixmap);
  if (bVar1) {
    this->d = &shared_empty;
  }
  else {
    pQVar2 = (QRegionData *)operator_new(0x10);
    this->d = pQVar2;
    (pQVar2->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
    pQVar3 = qt_bitmapToRegion(bm);
    this->d->qt_rgn = pQVar3;
  }
  return;
}

Assistant:

QRegion::QRegion(const QBitmap &bm)
{
    if (bm.isNull()) {
        d = const_cast<QRegionData*>(&shared_empty);
    } else {
        d = new QRegionData;
        d->ref.initializeOwned();
        d->qt_rgn = qt_bitmapToRegion(bm);
    }
}